

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O2

void __thiscall
Assimp::ObjExporter::indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::getKeys
          (indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare> *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *keys)

{
  pointer paVar1;
  undefined4 uVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (keys,(this->vecMap)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var3 = (this->vecMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->vecMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    lVar4 = (long)*(int *)((long)&p_Var3[1]._M_parent + 4);
    paVar1 = (keys->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar1[lVar4 + -1].z = *(float *)&p_Var3[1]._M_parent;
    uVar2 = *(undefined4 *)&p_Var3[1].field_0x4;
    paVar1 = paVar1 + lVar4 + -1;
    paVar1->x = (float)p_Var3[1]._M_color;
    paVar1->y = (float)uVar2;
  }
  return;
}

Assistant:

void getKeys( std::vector<T>& keys ) {
            keys.resize(vecMap.size());
            for(typename dataType::iterator it = vecMap.begin(); it != vecMap.end(); ++it){
                keys[it->second-1] = it->first;
            }
        }